

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t determine_blockSize(ZSTD_sequenceFormat_e mode,size_t blockSize,size_t remaining,
                          ZSTD_Sequence *inSeqs,size_t inSeqsSize,ZSTD_sequencePosition seqPos)

{
  uint uVar1;
  size_t err_code;
  size_t explicitBlockSize;
  size_t inSeqsSize_local;
  ZSTD_Sequence *inSeqs_local;
  size_t remaining_local;
  size_t blockSize_local;
  size_t sStack_10;
  ZSTD_sequenceFormat_e mode_local;
  
  if (mode == ZSTD_sf_noBlockDelimiters) {
    sStack_10 = blockSize_noDelimiter(blockSize,remaining);
  }
  else {
    sStack_10 = blockSize_explicitDelimiter(inSeqs,inSeqsSize,seqPos);
    uVar1 = ERR_isError(sStack_10);
    if (uVar1 == 0) {
      if (blockSize < sStack_10) {
        sStack_10 = 0xffffffffffffff95;
      }
      else if (remaining < sStack_10) {
        sStack_10 = 0xffffffffffffff95;
      }
    }
  }
  return sStack_10;
}

Assistant:

static size_t determine_blockSize(ZSTD_sequenceFormat_e mode,
                           size_t blockSize, size_t remaining,
                     const ZSTD_Sequence* inSeqs, size_t inSeqsSize, ZSTD_sequencePosition seqPos)
{
    DEBUGLOG(6, "determine_blockSize : remainingSize = %zu", remaining);
    if (mode == ZSTD_sf_noBlockDelimiters)
        return blockSize_noDelimiter(blockSize, remaining);
    {   size_t const explicitBlockSize = blockSize_explicitDelimiter(inSeqs, inSeqsSize, seqPos);
        FORWARD_IF_ERROR(explicitBlockSize, "Error while determining block size with explicit delimiters");
        if (explicitBlockSize > blockSize)
            RETURN_ERROR(externalSequences_invalid, "sequences incorrectly define a too large block");
        if (explicitBlockSize > remaining)
            RETURN_ERROR(externalSequences_invalid, "sequences define a frame longer than source");
        return explicitBlockSize;
    }
}